

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator::
enterNode(FastGeneralizationsIterator *this,Node **curr)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Term *pTVar5;
  long *plVar6;
  Node *pNVar7;
  long *in_RSI;
  Top TVar8;
  Node **byTop;
  Node *nl_1;
  Node **nl2;
  uint bindingFunctor;
  Node **nl;
  TermList binding;
  NodeAlgorithm currType;
  IntermediateNode *inode;
  undefined4 in_stack_ffffffffffffff58;
  NodeAlgorithm in_stack_ffffffffffffff5c;
  Stack<void_*> *in_stack_ffffffffffffff60;
  Stack<void_*> *pSVar9;
  bool local_93;
  bool local_92;
  bool local_91;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Node *local_50;
  void ***local_48;
  void ***local_38;
  
  pSVar9 = (Stack<void_*> *)*in_RSI;
  iVar2 = (**(code **)(pSVar9->_capacity + 0x28))();
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::getSpecVarBinding
            ((GenMatcher *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
  *in_RSI = 0;
  if (iVar2 == 1) {
    local_38 = &pSVar9->_end;
    bVar1 = Kernel::TermList::isTerm((TermList *)0x3957e2);
    if (bVar1) {
      pTVar5 = Kernel::TermList::term((TermList *)0x3957f5);
      uVar3 = Kernel::Term::functor(pTVar5);
      while( true ) {
        local_91 = false;
        if (*local_38 != (void **)0x0) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_38);
          local_91 = Kernel::TermList::isTerm((TermList *)0x395827);
        }
        if (local_91 == false) break;
        if (*in_RSI == 0) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_38);
          pTVar5 = Kernel::TermList::term((TermList *)0x395858);
          uVar4 = Kernel::Term::functor(pTVar5);
          if (uVar4 == uVar3) {
            *in_RSI = (long)*local_38;
          }
        }
        local_38 = local_38 + 1;
      }
      if ((*in_RSI == 0) && (local_48 = local_38, *local_38 != (void **)0x0)) {
        do {
          do {
            local_48 = local_48 + 1;
            if (*local_48 == (void **)0x0) goto LAB_00395971;
            SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_48);
            bVar1 = Kernel::TermList::isTerm((TermList *)0x3958d7);
          } while (!bVar1);
          SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_48);
          pTVar5 = Kernel::TermList::term((TermList *)0x3958f2);
          uVar4 = Kernel::Term::functor(pTVar5);
        } while (uVar4 != uVar3);
        *in_RSI = (long)*local_48;
      }
    }
    else {
      while( true ) {
        local_92 = false;
        if (*local_38 != (void **)0x0) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_38);
          local_92 = Kernel::TermList::isTerm((TermList *)0x395951);
        }
        if (local_92 == false) break;
        local_38 = local_38 + 1;
      }
    }
LAB_00395971:
    if ((*in_RSI == 0) && (*local_38 != (void **)0x0)) {
      *in_RSI = (long)*local_38;
      do {
        local_38 = local_38 + 1;
        local_93 = false;
        if (*local_38 != (void **)0x0) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term((Node *)*local_38);
          local_93 = Kernel::TermList::isTerm((TermList *)0x3959cf);
        }
      } while (local_93 != false);
    }
    if (*in_RSI != 0) {
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    if (*local_38 != (void **)0x0) {
      Lib::Stack<void_*>::push
                (in_stack_ffffffffffffff60,
                 (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::NodeAlgorithm>::
      push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::NodeAlgorithm>
            *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      return true;
    }
  }
  else {
    local_50 = Lib::
               SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
               ::listLike((SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
                           *)&pSVar9->_end);
    bVar1 = Kernel::TermList::isTerm((TermList *)0x395a84);
    if (bVar1) {
      TVar8 = Kernel::TermList::top
                        ((TermList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      plVar6 = (long *)(**(code **)(pSVar9->_capacity + 0x50))
                                 (pSVar9,TVar8._inner._inner._0_8_,TVar8._inner._inner._content[7],0
                                 );
      in_stack_ffffffffffffff60 = pSVar9;
      if (plVar6 != (long *)0x0) {
        *in_RSI = *plVar6;
      }
    }
    if (*in_RSI == 0) {
      pNVar7 = Lib::
               SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
               ::Node::head(local_50);
      SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term(pNVar7);
      bVar1 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff60);
      if (bVar1) {
        pNVar7 = Lib::
                 SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
                 ::Node::head(local_50);
        *in_RSI = (long)pNVar7;
        local_50 = Lib::
                   SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
                   ::Node::tail(local_50);
      }
    }
    if (local_50 != (Node *)0x0) {
      pNVar7 = Lib::
               SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::SListIntermediateNode::NodePtrComparator>
               ::Node::head(local_50);
      SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node::term(pNVar7);
      bVar1 = Kernel::TermList::isTerm((TermList *)0x395b80);
      if (bVar1) {
        local_50 = (Node *)0x0;
      }
    }
    if (*in_RSI != 0) {
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    if (local_50 != (Node *)0x0) {
      Lib::Stack<void_*>::push
                (in_stack_ffffffffffffff60,
                 (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::NodeAlgorithm>::
      push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::NodeAlgorithm>
            *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      return true;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::enterNode(Node*& curr)
{
  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList binding = _subst.getSpecVarBinding(inode->childVar);
  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    if(binding.isTerm()) {
      unsigned bindingFunctor=binding.term()->functor();
      //let's first skip proper term nodes at the beginning...
      while(*nl && (*nl)->term().isTerm()) {
        //...and have the one that interests us, if we encounter it.
        if(!curr && (*nl)->term().term()->functor()==bindingFunctor) {
          curr=*nl;
        }
        nl++;
      }
      if(!curr && *nl) {
        //we've encountered a variable node, but we still have to check, whether
        //the one proper term node, that interests us, isn't here
        Node** nl2=nl+1;
        while(*nl2) {
          if((*nl2)->term().isTerm() && (*nl2)->term().term()->functor()==bindingFunctor) {
            curr=*nl2;
            break;
          }
          nl2++;
        }
      }
    } else {
      //let's first skip proper term nodes at the beginning
      while(*nl && (*nl)->term().isTerm()) {
        nl++;
      }
    }
    if(!curr && *nl) {
      curr=*(nl++);
      while(*nl && (*nl)->term().isTerm()) {
	nl++;
      }
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    if(binding.isTerm()) {
      Node** byTop=inode->childByTop(binding.top(), false);
      if(byTop) {
	curr=*byTop;
      }
    }
    if(!curr && nl->head()->term().isVar()) {
      curr=nl->head();
      nl=nl->tail();
    }
    //in SkipList nodes variables are only at the beginning
    //(so if there aren't any, there aren't any at all)
    if(nl && nl->head()->term().isTerm()) {
      nl=0;
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}